

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>,double>
               (AVisitor<hiberlite::UpdateBean> *ar,
               set<double,_std::less<double>,_std::allocator<double>_> *m,uint param_3)

{
  stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_> _s;
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  local_e0;
  stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_> local_a8
  ;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  body;
  uint param_2_local;
  set<double,_std::less<double>,_std::allocator<double>_> *m_local;
  AVisitor<hiberlite::UpdateBean> *ar_local;
  
  body.stream.xx._4_4_ = param_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"items",&local_79);
  stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>::
  stl_stream_adapter(&local_a8,m);
  _s.it._M_node = local_a8.it._M_node;
  _s.ct = local_a8.ct;
  _s.xx = local_a8.xx;
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  ::collection_nvp((collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
                    *)local_58,(string *)local_78,_s);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  ::collection_nvp(&local_e0,
                   (collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
                    *)local_58);
  AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_e0);
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  ::~collection_nvp(&local_e0);
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  ::~collection_nvp((collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
                     *)local_58);
  return;
}

Assistant:

void hibernate(A& ar, std::set<Key>& m, const unsigned int)
{
	typedef Key ElType;
	collection_nvp<ElType,stl_stream_adapter<ElType,std::set<Key> > >
			body( "items", stl_stream_adapter<ElType,std::set<Key> >(m) );
	ar & body;
}